

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void cacheEntryClear(Parse *pParse,int i)

{
  byte bVar1;
  int iVar2;
  i16 iVar3;
  u8 uVar4;
  undefined1 uVar5;
  yColCache *pyVar6;
  yColCache *pyVar7;
  int i_local;
  Parse *pParse_local;
  
  if ((pParse->aColCache[i].tempReg != '\0') && (pParse->nTempReg < 8)) {
    iVar2 = pParse->aColCache[i].iReg;
    bVar1 = pParse->nTempReg;
    pParse->nTempReg = bVar1 + 1;
    pParse->aTempReg[bVar1] = iVar2;
  }
  pParse->nColCache = pParse->nColCache + 0xff;
  if (i < (int)(uint)pParse->nColCache) {
    pyVar6 = pParse->aColCache + i;
    pyVar7 = pParse->aColCache + pParse->nColCache;
    iVar3 = pyVar7->iColumn;
    uVar4 = pyVar7->tempReg;
    uVar5 = pyVar7->field_0x7;
    pyVar6->iTable = pyVar7->iTable;
    pyVar6->iColumn = iVar3;
    pyVar6->tempReg = uVar4;
    pyVar6->field_0x7 = uVar5;
    iVar2 = pyVar7->iReg;
    pyVar6->iLevel = pyVar7->iLevel;
    pyVar6->iReg = iVar2;
    pyVar6->lru = pyVar7->lru;
  }
  return;
}

Assistant:

static void cacheEntryClear(Parse *pParse, int i){
  if( pParse->aColCache[i].tempReg ){
    if( pParse->nTempReg<ArraySize(pParse->aTempReg) ){
      pParse->aTempReg[pParse->nTempReg++] = pParse->aColCache[i].iReg;
    }
  }
  pParse->nColCache--;
  if( i<pParse->nColCache ){
    pParse->aColCache[i] = pParse->aColCache[pParse->nColCache];
  }
}